

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divideAndConquer.cpp
# Opt level: O3

Num * __thiscall
divideAndConquer::multiply(Num *__return_storage_ptr__,divideAndConquer *this,Num *n1,Num *n2)

{
  Num *this_00;
  Num *this_01;
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  Short SVar4;
  Short SVar5;
  uint uVar6;
  ushort length;
  uint __uval;
  uint __val;
  uint __len;
  Num tk1;
  string str_t;
  Num x1;
  Halves a;
  Num x4;
  Num x3;
  Num x2;
  Num t_2m;
  Halves b;
  Num NStack_258;
  string local_230;
  Halves local_210;
  pair<Num,_Num> local_1c0;
  Num local_170;
  Num local_148;
  Num local_120;
  Num local_f8;
  Num local_d0;
  Num local_a8;
  pair<Num,_Num> local_80;
  
  uVar1 = n1->size;
  length = n2->size;
  if (length == 1 || uVar1 == 1) {
    gradeSchoolMultiplication::gradeSchoolMultiplication((gradeSchoolMultiplication *)&local_1c0);
    gradeSchoolMultiplication::multiply
              (__return_storage_ptr__,(gradeSchoolMultiplication *)&local_1c0,n1,n2);
    gradeSchoolMultiplication::~gradeSchoolMultiplication((gradeSchoolMultiplication *)&local_1c0);
  }
  else {
    if (length < uVar1) {
      length = uVar1;
    }
    std::pair<Num,_Num>::pair<Num,_Num,_true>(&local_1c0);
    std::pair<Num,_Num>::pair<Num,_Num,_true>(&local_80);
    Num::getHalf(&local_210,n1,length);
    Num::operator=(&local_1c0.first,&local_210.first);
    this_00 = &local_1c0.second;
    Num::operator=(this_00,&local_210.second);
    Num::~Num(&local_210.second);
    Num::~Num(&local_210.first);
    Num::getHalf(&local_210,n2,length);
    Num::operator=(&local_80.first,&local_210.first);
    this_01 = &local_80.second;
    Num::operator=(this_01,&local_210.second);
    Num::~Num(&local_210.second);
    Num::~Num(&local_210.first);
    Num::Num(&local_210.first);
    Num::Num(&local_120);
    Num::Num(&local_148);
    Num::Num(&local_170);
    (**(this->super_Multiplicator)._vptr_Multiplicator)(&NStack_258,this,this_00,this_01);
    Num::operator=(&local_210.first,&NStack_258);
    Num::~Num(&NStack_258);
    (**(this->super_Multiplicator)._vptr_Multiplicator)(&NStack_258,this,&local_1c0,this_01);
    Num::operator=(&local_120,&NStack_258);
    Num::~Num(&NStack_258);
    (**(this->super_Multiplicator)._vptr_Multiplicator)(&NStack_258,this,this_00,&local_80);
    Num::operator=(&local_148,&NStack_258);
    Num::~Num(&NStack_258);
    (**(this->super_Multiplicator)._vptr_Multiplicator)(&NStack_258,this,&local_1c0,&local_80);
    Num::operator=(&local_170,&NStack_258);
    Num::~Num(&NStack_258);
    SVar4 = Num::getNumber(&local_120);
    SVar5 = Num::getNumber(&local_148);
    __val = (uint)SVar5 + (uint)SVar4;
    __len = 1;
    if (9 < __val) {
      uVar6 = __val;
      uVar3 = 4;
      do {
        __len = uVar3;
        if (uVar6 < 100) {
          __len = __len - 2;
          goto LAB_00104c4b;
        }
        if (uVar6 < 1000) {
          __len = __len - 1;
          goto LAB_00104c4b;
        }
        if (uVar6 < 10000) goto LAB_00104c4b;
        bVar2 = 99999 < uVar6;
        uVar6 = uVar6 / 10000;
        uVar3 = __len + 4;
      } while (bVar2);
      __len = __len + 1;
    }
LAB_00104c4b:
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_230,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_230._M_dataplus._M_p,__len,__val);
    Num::multiplyByPowerOfTen(&NStack_258,&local_170,length);
    Num::Num(&local_a8,&local_230,(Short)local_230._M_string_length);
    Num::multiplyByPowerOfTen(&local_f8,&local_a8,length >> 1);
    Num::operator+(&local_d0,&NStack_258,&local_f8);
    Num::operator+(__return_storage_ptr__,&local_d0,&local_210.first);
    Num::~Num(&local_d0);
    Num::~Num(&local_f8);
    Num::~Num(&local_a8);
    Num::~Num(&NStack_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    Num::~Num(&local_170);
    Num::~Num(&local_148);
    Num::~Num(&local_120);
    Num::~Num(&local_210.first);
    Num::~Num(this_01);
    Num::~Num(&local_80.first);
    Num::~Num(&local_1c0.second);
    Num::~Num(&local_1c0.first);
  }
  return __return_storage_ptr__;
}

Assistant:

Num divideAndConquer::multiply(const Num& n1, const Num& n2)
{
    if (n1.size == 1 || n2.size == 1)
    {
        gradeSchoolMultiplication t;

        return t.multiply(n1,n2);
    }

    Short m = std::max(n1.size, n2.size);
    Halves a, b;
    a = n1.getHalf(m);
    b = n2.getHalf(m);

    Num x1, x2, x3, x4;
    x1 = multiply(a.second, b.second);
    x2 = multiply(a.first, b.second);
    x3 = multiply(a.second, b.first);
    x4 = multiply(a.first, b.first);

    int t_x2 = x2.getNumber() + x3.getNumber();

    std::string str_t = std::to_string(t_x2);

    Num tk1 = x4.multiplyByPowerOfTen(m);
    Num t_2m (str_t, str_t.size());

    if (m % 2)
    {
        --m;
    }

    Num x5 =  tk1 + (t_2m).multiplyByPowerOfTen(m / 2) + x1;

    return x5;
}